

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsFboUtil.cpp
# Opt level: O2

bool __thiscall
deqp::gls::FboUtil::FormatDB::ExtensionInfo::operator<(ExtensionInfo *this,ExtensionInfo *other)

{
  bool bVar1;
  bool bVar2;
  
  bVar1 = std::operator<(&(this->requiredExtensions)._M_t,&(other->requiredExtensions)._M_t);
  bVar2 = true;
  if (!bVar1) {
    bVar2 = std::operator==(&(this->requiredExtensions)._M_t,&(other->requiredExtensions)._M_t);
    if (bVar2) {
      bVar2 = (int)this->flags < (int)other->flags;
    }
    else {
      bVar2 = false;
    }
  }
  return bVar2;
}

Assistant:

bool FormatDB::ExtensionInfo::operator< (const ExtensionInfo& other) const
{
	return (requiredExtensions < other.requiredExtensions) ||
		   ((requiredExtensions == other.requiredExtensions) && (flags < other.flags));
}